

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::~TypedAttribute
          (TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *this)

{
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional
            (&this->_attrib);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  AttrMetas::~AttrMetas(&this->_metas);
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }